

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalctocsv.cpp
# Opt level: O1

void doit(bool skipheader,bool fullprecision,bool show_exposure_value,
         bool remove_zero_exposure_records,bool ord_output,bool all_idx,bool parquet_output,
         string *parquetOutFile)

{
  pointer pcVar1;
  string parquetOutFile_00;
  int iVar2;
  size_t sVar3;
  int *piVar4;
  undefined7 in_register_00000009;
  char *pcVar5;
  uint uVar6;
  uint uVar7;
  undefined4 uVar8;
  int summary_set;
  summarySampleslevelHeader sh;
  int samplesize;
  int summarycalcstream_type;
  undefined8 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff74;
  uint uVar9;
  uint local_88;
  float local_84;
  undefined4 local_68;
  uint local_64;
  timespec local_60;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if ((int)CONCAT71(in_register_00000009,remove_zero_exposure_records) != 0) {
    pcVar1 = (parquetOutFile->_M_dataplus)._M_p;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar1,pcVar1 + parquetOutFile->_M_string_length);
    parquetOutFile_00._M_string_length._0_4_ = in_stack_ffffffffffffff60;
    parquetOutFile_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff58;
    parquetOutFile_00._M_string_length._4_4_ = in_stack_ffffffffffffff64;
    parquetOutFile_00.field_2._M_allocated_capacity._0_4_ = in_stack_ffffffffffffff68;
    parquetOutFile_00.field_2._M_allocated_capacity._4_4_ = in_stack_ffffffffffffff6c;
    parquetOutFile_00.field_2._8_4_ = in_stack_ffffffffffffff70;
    parquetOutFile_00.field_2._12_4_ = in_stack_ffffffffffffff74;
    doitz(skipheader,fullprecision,show_exposure_value,ord_output,all_idx,parquet_output,
          parquetOutFile_00);
    if (local_50[0] == local_40) {
      return;
    }
    operator_delete(local_50[0]);
    return;
  }
  local_64 = 0;
  fread(&local_64,4,1,_stdin);
  if ((~local_64 & 0x3000000) != 0) {
    std::operator<<((ostream *)&std::cerr,"FATAL: Not a summarycalc stream type\n");
    exit(-1);
  }
  if ((local_64 & 0xffffff) != 1) {
    doit();
    return;
  }
  if (!skipheader) {
    if (ord_output) {
      pcVar5 = "EventId,SummaryId,SampleId,Loss,ImpactedExposure";
    }
    else {
      if (parquet_output) goto LAB_001017d7;
      pcVar5 = "event_id,summary_id,sidx,loss";
      if (show_exposure_value) {
        pcVar5 = "event_id,exposure_value,summary_id,sidx,loss";
      }
    }
    puts(pcVar5);
  }
LAB_001017d7:
  local_68 = 0;
  sVar3 = fread(&local_68,4,1,_stdin);
  if ((sVar3 != 0) && (sVar3 = fread(&stack0xffffffffffffff70,4,1,_stdin), sVar3 != 0)) {
    uVar7 = (uint)fullprecision;
    uVar6 = (uint)show_exposure_value;
    while ((uVar9 = in_stack_ffffffffffffff74, sVar3 = fread(&stack0xffffffffffffff74,0xc,1,_stdin),
           sVar3 != 0 &&
           (in_stack_ffffffffffffff74 = uVar9, sVar3 = fread(&stack0xffffffffffffff60,8,1,_stdin),
           sVar3 != 0))) {
      while (in_stack_ffffffffffffff60 != 0) {
        if (in_stack_ffffffffffffff60 != -5 || all_idx) {
          rowcount = rowcount + 1;
          if ((char)uVar7 == '\0') {
            if (ord_output) {
              uVar8 = SUB84((double)in_stack_ffffffffffffff64,0);
              pcVar5 = "%d,%d,%d,%.2f,%.2f\n";
              goto LAB_00101922;
            }
            if (!parquet_output) {
              if ((char)uVar6 == '\0') {
                uVar8 = SUB84((double)in_stack_ffffffffffffff64,0);
                pcVar5 = "%d,%d,%d,%.2f\n";
                goto LAB_00101a17;
              }
              pcVar5 = "%d,%.2f,%d,%d,%.2f\n";
LAB_001019dd:
              printf(pcVar5,SUB84((double)local_84,0),(double)in_stack_ffffffffffffff64,(ulong)uVar9
                     ,(ulong)local_88);
            }
          }
          else if (ord_output) {
            uVar8 = SUB84((double)in_stack_ffffffffffffff64,0);
            pcVar5 = "%d,%d,%d,%f,%f\n";
LAB_00101922:
            printf(pcVar5,uVar8,
                   (double)(float)(~-(uint)(in_stack_ffffffffffffff64 == 0.0) & (uint)local_84),
                   (ulong)uVar9,(ulong)local_88);
          }
          else if (!parquet_output) {
            if ((char)uVar6 != '\0') {
              pcVar5 = "%d,%f,%d,%d,%f\n";
              goto LAB_001019dd;
            }
            uVar8 = SUB84((double)in_stack_ffffffffffffff64,0);
            pcVar5 = "%d,%d,%d,%f\n";
LAB_00101a17:
            printf(pcVar5,uVar8,(ulong)uVar9,(ulong)local_88);
          }
          if (firstOutput == true) {
            local_60.tv_sec = 1;
            local_60.tv_nsec = 0;
            do {
              iVar2 = nanosleep(&local_60,&local_60);
              if (iVar2 != -1) break;
              piVar4 = __errno_location();
            } while (*piVar4 == 4);
            firstOutput = false;
          }
        }
        sVar3 = fread(&stack0xffffffffffffff60,8,1,_stdin);
        if (sVar3 == 0) {
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void doit(bool skipheader, bool fullprecision,bool show_exposure_value,
	  bool remove_zero_exposure_records, bool ord_output, bool all_idx,
	  bool parquet_output, std::string parquetOutFile)
{
	if (remove_zero_exposure_records == true) {
		doitz(skipheader, fullprecision, show_exposure_value, ord_output, all_idx, parquet_output, parquetOutFile);
		return;
	}
	int summarycalcstream_type = 0;
	size_t i = fread(&summarycalcstream_type, sizeof(summarycalcstream_type), 1, stdin);
	int stream_type = summarycalcstream_type & summarycalc_id;

	if (stream_type != summarycalc_id) {
		std::cerr << "FATAL: Not a summarycalc stream type\n";
		exit(-1);
	}
	stream_type = streamno_mask & summarycalcstream_type;

	if (stream_type == 1 ){
		if (skipheader == false) {
			// ORD output flag takes priority over exposure value flag
			// ImpactedNumLocs not currently supported in ORD output
			if (ord_output == true) {
				printf("EventId,SummaryId,SampleId,Loss,ImpactedExposure\n");
			} else if (parquet_output == false) {
				if (show_exposure_value == true)
					printf("event_id,exposure_value,summary_id,sidx,loss\n");
				else printf("event_id,summary_id,sidx,loss\n");
			}
		}
#ifdef HAVE_PARQUET
		parquet::StreamWriter os;
		if (parquet_output == true)
			os = OasisParquet::GetParquetStreamWriter(OasisParquet::SELT,
								  parquetOutFile);
#endif
		int samplesize=0;
		int summary_set = 0;
		i=fread(&samplesize, sizeof(samplesize), 1, stdin);
		if( i != 0) i=fread(&summary_set, sizeof(samplesize), 1, stdin);
		while (i != 0){
			summarySampleslevelHeader sh;
			i = fread(&sh, sizeof(sh), 1, stdin);
			while (i != 0){
				sampleslevelRec sr;
				i = fread(&sr, sizeof(sr), 1, stdin);
				if (i == 0) break;	
				if (sr.sidx == 0) break;
				if (!all_idx && sr.sidx == max_loss_idx) {   // Only output MaxLoss if flag set
					continue;
				}
				rowcount++;
#ifdef HAVE_PARQUET
				if (parquet_output == true) {
					float impacted_exp = sh.expval;
					if (sr.loss == 0) impacted_exp = 0;
					os << sh.event_id << sh.summary_id
					   << sr.sidx << (float)sr.loss
					   << impacted_exp << parquet::EndRow;
				}
#endif
				if (fullprecision == true) {
					// ORD output flag takes priority over exposure value flag
					if (ord_output == true) {
						OASIS_FLOAT impacted_exp = sh.expval;
						if (sr.loss == 0) impacted_exp = 0;
						printf("%d,%d,%d,%f,%f\n", sh.event_id, sh.summary_id, sr.sidx, sr.loss, impacted_exp);
					} else if (parquet_output == false) {
						if (show_exposure_value == true) {
							printf("%d,%f,%d,%d,%f\n", sh.event_id, sh.expval, sh.summary_id, sr.sidx, sr.loss);
						} else {
							printf("%d,%d,%d,%f\n", sh.event_id, sh.summary_id, sr.sidx, sr.loss);
						}
					}
				} else {
					// ORD output flag takes priority over exposure value flag
					if (ord_output == true) {
						OASIS_FLOAT impacted_exp = sh.expval;
						if (sr.loss == 0) impacted_exp = 0;
						printf("%d,%d,%d,%.2f,%.2f\n", sh.event_id, sh.summary_id, sr.sidx, sr.loss, impacted_exp);
					} else if (parquet_output == false) {
						if (show_exposure_value == true) {
							printf("%d,%.2f,%d,%d,%.2f\n", sh.event_id, sh.expval, sh.summary_id, sr.sidx, sr.loss);
						} else {
							printf("%d,%d,%d,%.2f\n", sh.event_id, sh.summary_id, sr.sidx, sr.loss);
						}
					}
				}
				if (firstOutput==true){
					std::this_thread::sleep_for(std::chrono::milliseconds(PIPE_DELAY));  // used to stop possible race condition with kat
					firstOutput=false;
				} 				
			}
		}
		return;
	}
	fprintf(stderr,"FATAL: Unsupported summarycalc stream type\n");

}